

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

int If_DsdManOperation(If_DsdMan_t *p,int Type,int *pLits,int nLits,uchar *pPerm,word *pTruth)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int c;
  If_DsdObj_t *pObj;
  Vec_Ptr_t *pVVar5;
  void *pvVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uchar *puVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  uint local_124;
  ulong local_118;
  uchar *local_100;
  uchar pPermNew [12];
  char pCanonPerm [12];
  int pBegEnd [12];
  int pChildren [12];
  
  if (Type - 3U < 2) {
    pVVar5 = &p->vObjs;
    uVar13 = 0;
    uVar7 = (ulong)(uint)nLits;
    if (nLits < 1) {
      uVar7 = uVar13;
    }
    uVar9 = 0;
    local_124 = 0;
    local_118 = 0;
    puVar11 = pPerm;
    for (; uVar13 != uVar7; uVar13 = uVar13 + 1) {
      if ((Type == 4) && (iVar2 = Abc_LitIsCompl(pLits[uVar13]), iVar2 != 0)) {
        iVar2 = Abc_LitNot(pLits[uVar13]);
        pLits[uVar13] = iVar2;
        local_124 = local_124 ^ 1;
      }
      iVar2 = Abc_Lit2Var(pLits[uVar13]);
      pObj = (If_DsdObj_t *)Vec_PtrEntry(pVVar5,iVar2);
      lVar14 = (long)(int)local_118;
      if (((*(uint *)&pObj->field_0x4 & 7) == Type) &&
         ((Type == 4 || (iVar2 = Abc_LitIsCompl(pLits[uVar13]), iVar2 == 0)))) {
        lVar12 = 0;
        while( true ) {
          uVar4 = *(uint *)&pObj->field_0x4;
          uVar8 = (uint)lVar12;
          if (uVar4 >> 0x1b <= uVar8) break;
          iVar2 = If_DsdObjFaninLit(pObj,uVar8);
          if (iVar2 == 0) {
            uVar4 = *(uint *)&pObj->field_0x4;
            break;
          }
          if ((Type != 3) && (iVar3 = Abc_LitIsCompl(iVar2), iVar3 != 0)) {
            __assert_fail("Type == IF_DSD_AND || !Abc_LitIsCompl(iFanin)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                          ,0x60c,
                          "int If_DsdManOperation(If_DsdMan_t *, int, int *, int, unsigned char *, word *)"
                         );
          }
          pChildren[lVar14 + lVar12] = iVar2;
          iVar3 = If_DsdVecLitSuppSize(pVVar5,iVar2);
          pBegEnd[lVar14 + lVar12] = iVar3 + uVar9 | uVar9 << 0x10;
          iVar2 = If_DsdVecLitSuppSize(pVVar5,iVar2);
          uVar9 = uVar9 + iVar2;
          lVar12 = lVar12 + 1;
        }
        uVar8 = (int)local_118 + uVar8;
        uVar4 = uVar4 >> 3 & 0x1f;
      }
      else {
        iVar2 = pLits[uVar13];
        iVar3 = If_DsdManPushInv(p,iVar2,puVar11);
        iVar2 = Abc_LitNotCond(iVar2,iVar3);
        pChildren[lVar14] = iVar2;
        uVar4 = *(uint *)&pObj->field_0x4 >> 3 & 0x1f;
        uVar8 = (int)local_118 + 1;
        pBegEnd[lVar14] = uVar9 << 0x10 | uVar4 + uVar9;
        uVar9 = uVar4 + uVar9;
      }
      local_118 = (ulong)uVar8;
      puVar11 = puVar11 + uVar4;
    }
    If_DsdObjSort(p,pVVar5,pChildren,(int)local_118,pBegEnd);
    uVar13 = 0;
    uVar7 = 0;
    if (0 < (int)local_118) {
      uVar7 = local_118;
    }
    uVar8 = 0;
    for (; uVar13 != uVar7; uVar13 = uVar13 + 1) {
      uVar4 = pBegEnd[uVar13];
      puVar11 = pPermNew + (int)uVar8;
      for (lVar14 = (long)((int)uVar4 >> 0x10); lVar14 < (long)(ulong)(uVar4 & 0xff);
          lVar14 = lVar14 + 1) {
        *puVar11 = pPerm[lVar14];
        uVar8 = uVar8 + 1;
        puVar11 = puVar11 + 1;
      }
    }
    if (uVar8 != uVar9) {
      __assert_fail("j == nSSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                    ,0x61f,
                    "int If_DsdManOperation(If_DsdMan_t *, int, int *, int, unsigned char *, word *)"
                   );
    }
    uVar13 = 0;
    uVar7 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar7 = uVar13;
    }
    for (; uVar7 != uVar13; uVar13 = uVar13 + 1) {
      pPerm[uVar13] = pPermNew[uVar13];
    }
  }
  else if (Type == 6) {
    uVar9 = Abc_TtCanonicize(pTruth,nLits,pCanonPerm);
    uVar8 = If_DsdManComputeFirstArray(p,pLits,nLits,pBegEnd);
    uVar7 = 0;
    local_118 = 0;
    if (0 < nLits) {
      local_118 = (ulong)(uint)nLits;
    }
    uVar4 = 0;
    for (; uVar7 != local_118; uVar7 = uVar7 + 1) {
      iVar3 = Abc_LitNotCond(pLits[pCanonPerm[uVar7]],
                             (uint)((uVar9 >> ((uint)uVar7 & 0x1f) & 1) != 0));
      iVar2 = Abc_Lit2Var(iVar3);
      pvVar6 = Vec_PtrEntry(&p->vObjs,iVar2);
      iVar2 = pBegEnd[pCanonPerm[uVar7]];
      c = If_DsdManPushInv(p,iVar3,pPerm + iVar2);
      iVar3 = Abc_LitNotCond(iVar3,c);
      pChildren[uVar7] = iVar3;
      uVar1 = *(uint *)((long)pvVar6 + 4);
      for (uVar13 = 0; (uVar1 >> 3 & 0x1f) != uVar13; uVar13 = uVar13 + 1) {
        pPermNew[uVar13 + (long)(int)uVar4] = (pPerm + iVar2)[uVar13];
      }
      uVar4 = uVar4 + (int)uVar13;
    }
    if (uVar4 != uVar8) {
      __assert_fail("j == nSSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                    ,0x65c,
                    "int If_DsdManOperation(If_DsdMan_t *, int, int *, int, unsigned char *, word *)"
                   );
    }
    local_124 = uVar9 >> ((byte)nLits & 0x1f) & 1;
    uVar13 = 0;
    uVar7 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar7 = uVar13;
    }
    for (; uVar7 != uVar13; uVar13 = uVar13 + 1) {
      pPerm[uVar13] = pPermNew[uVar13];
    }
    Abc_TtStretch6(pTruth,nLits,p->nVars);
  }
  else {
    if (Type != 5) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                    ,0x661,
                    "int If_DsdManOperation(If_DsdMan_t *, int, int *, int, unsigned char *, word *)"
                   );
    }
    if (nLits != 3) {
      __assert_fail("nLits == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                    ,0x626,
                    "int If_DsdManOperation(If_DsdMan_t *, int, int *, int, unsigned char *, word *)"
                   );
    }
    pVVar5 = &p->vObjs;
    puVar11 = pPerm;
    for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
      iVar2 = Abc_Lit2Var(pLits[lVar14]);
      pvVar6 = Vec_PtrEntry(pVVar5,iVar2);
      iVar2 = pLits[lVar14];
      iVar3 = If_DsdManPushInv(p,iVar2,puVar11);
      iVar2 = Abc_LitNotCond(iVar2,iVar3);
      pLits[lVar14] = iVar2;
      puVar11 = puVar11 + (*(uint *)((long)pvVar6 + 4) >> 3 & 0x1f);
    }
    iVar2 = If_DsdObjCompare(p,pVVar5,pLits[1],pLits[2]);
    if ((iVar2 == 1) || ((iVar2 == 0 && (iVar2 = Abc_LitIsCompl(*pLits), iVar2 != 0)))) {
      uVar9 = If_DsdVecLitSuppSize(pVVar5,*pLits);
      uVar8 = If_DsdVecLitSuppSize(pVVar5,pLits[1]);
      uVar4 = If_DsdVecLitSuppSize(pVVar5,pLits[2]);
      iVar2 = Abc_LitNot(*pLits);
      *pLits = iVar2;
      *(ulong *)(pLits + 1) =
           CONCAT44((int)*(undefined8 *)(pLits + 1),(int)((ulong)*(undefined8 *)(pLits + 1) >> 0x20)
                   );
      uVar7 = (ulong)uVar9;
      for (uVar13 = 0; uVar7 != uVar13; uVar13 = uVar13 + 1) {
        pPermNew[uVar13] = pPerm[uVar13];
      }
      for (uVar13 = 0; uVar4 != uVar13; uVar13 = uVar13 + 1) {
        pPermNew[uVar13 + uVar7] = pPerm[uVar13 + (uVar8 + uVar9)];
      }
      for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
        pPermNew[uVar13 + uVar10 + uVar7] = pPerm[uVar10 + uVar7];
      }
      for (uVar7 = 0; uVar8 + uVar9 + uVar4 != uVar7; uVar7 = uVar7 + 1) {
        pPerm[uVar7] = pPermNew[uVar7];
      }
    }
    iVar2 = Abc_LitIsCompl(pLits[1]);
    if (iVar2 != 0) {
      iVar3 = Abc_LitNot(pLits[1]);
      pLits[1] = iVar3;
      iVar3 = Abc_LitNot(pLits[2]);
      pLits[2] = iVar3;
    }
    local_124 = (uint)(iVar2 != 0);
    local_118 = 3;
    local_100 = pPerm;
    for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
      iVar2 = Abc_Lit2Var(pLits[lVar14]);
      pvVar6 = Vec_PtrEntry(pVVar5,iVar2);
      iVar2 = pLits[lVar14];
      iVar3 = If_DsdManPushInv(p,iVar2,local_100);
      iVar2 = Abc_LitNotCond(iVar2,iVar3);
      pChildren[lVar14] = iVar2;
      local_100 = local_100 + (*(uint *)((long)pvVar6 + 4) >> 3 & 0x1f);
    }
  }
  iVar2 = If_DsdObjFindOrAdd(p,Type,pChildren,(int)local_118,pTruth);
  iVar2 = Abc_Var2Lit(iVar2,local_124);
  return iVar2;
}

Assistant:

int If_DsdManOperation( If_DsdMan_t * p, int Type, int * pLits, int nLits, unsigned char * pPerm, word * pTruth )
{
    If_DsdObj_t * pObj, * pFanin;
    unsigned char pPermNew[DAU_MAX_VAR], * pPermStart = pPerm;
    int nChildren = 0, pChildren[DAU_MAX_VAR], pBegEnd[DAU_MAX_VAR];
    int i, k, j, Id, iFanin, fCompl = 0, nSSize = 0;
    if ( Type == IF_DSD_AND || Type == IF_DSD_XOR )
    {
        for ( k = 0; k < nLits; k++ )
        {
            if ( Type == IF_DSD_XOR && Abc_LitIsCompl(pLits[k]) )
            {
                pLits[k] = Abc_LitNot(pLits[k]);
                fCompl ^= 1;
            }
            pObj = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(pLits[k]) );
            if ( Type == If_DsdObjType(pObj) && (Type == IF_DSD_XOR || !Abc_LitIsCompl(pLits[k])) )
            {
                If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
                {
                    assert( Type == IF_DSD_AND || !Abc_LitIsCompl(iFanin) );
                    pChildren[nChildren] = iFanin;
                    pBegEnd[nChildren++] = (nSSize << 16) | (nSSize + If_DsdVecLitSuppSize(&p->vObjs, iFanin));
                    nSSize += If_DsdVecLitSuppSize(&p->vObjs, iFanin);
                }
            }
            else
            {
                pChildren[nChildren] = Abc_LitNotCond( pLits[k], If_DsdManPushInv(p, pLits[k], pPermStart) );
                pBegEnd[nChildren++] = (nSSize << 16) | (nSSize + If_DsdObjSuppSize(pObj));
                nSSize += If_DsdObjSuppSize(pObj);
            }
            pPermStart += If_DsdObjSuppSize(pObj);
        }
        If_DsdObjSort( p, &p->vObjs, pChildren, nChildren, pBegEnd );
        // create permutation
        for ( j = i = 0; i < nChildren; i++ )
            for ( k = (pBegEnd[i] >> 16); k < (pBegEnd[i] & 0xFF); k++ )
                pPermNew[j++] = pPerm[k];
        assert( j == nSSize );
        for ( j = 0; j < nSSize; j++ )
            pPerm[j] = pPermNew[j];
    }
    else if ( Type == IF_DSD_MUX )
    {
        int RetValue;
        assert( nLits == 3 );
        for ( k = 0; k < nLits; k++ )
        {
            pFanin = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(pLits[k]) );
            pLits[k] = Abc_LitNotCond( pLits[k], If_DsdManPushInv(p, pLits[k], pPermStart) );
            pPermStart += pFanin->nSupp;
        }
        RetValue = If_DsdObjCompare( p, &p->vObjs, pLits[1], pLits[2] );
        if ( RetValue == 1 || (RetValue == 0 && Abc_LitIsCompl(pLits[0])) )
        {
            int nSupp0 = If_DsdVecLitSuppSize( &p->vObjs, pLits[0] );
            int nSupp1 = If_DsdVecLitSuppSize( &p->vObjs, pLits[1] );
            int nSupp2 = If_DsdVecLitSuppSize( &p->vObjs, pLits[2] );
            pLits[0] = Abc_LitNot(pLits[0]);
            ABC_SWAP( int, pLits[1], pLits[2] );
            for ( j = k = 0; k < nSupp0; k++ )
                pPermNew[j++] = pPerm[k];
            for ( k = 0; k < nSupp2; k++ )
                pPermNew[j++] = pPerm[nSupp0 + nSupp1 + k];
            for ( k = 0; k < nSupp1; k++ )
                pPermNew[j++] = pPerm[nSupp0 + k];
            for ( j = 0; j < nSupp0 + nSupp1 + nSupp2; j++ )
                pPerm[j] = pPermNew[j];
        }
        if ( Abc_LitIsCompl(pLits[1]) )
        {
            pLits[1] = Abc_LitNot(pLits[1]);
            pLits[2] = Abc_LitNot(pLits[2]);
            fCompl ^= 1;
        }
        pPermStart = pPerm;
        for ( k = 0; k < nLits; k++ )
        {
            pFanin = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(pLits[k]) );
            pChildren[nChildren++] = Abc_LitNotCond( pLits[k], If_DsdManPushInv(p, pLits[k], pPermStart) );
            pPermStart += pFanin->nSupp;
        }
    }
    else if ( Type == IF_DSD_PRIME )
    {
        char pCanonPerm[DAU_MAX_VAR];
        int i, uCanonPhase, pFirsts[DAU_MAX_VAR];
        uCanonPhase = Abc_TtCanonicize( pTruth, nLits, pCanonPerm );
        fCompl = ((uCanonPhase >> nLits) & 1);
        nSSize = If_DsdManComputeFirstArray( p, pLits, nLits, pFirsts );
        for ( j = i = 0; i < nLits; i++ )
        {
            int iLitNew = Abc_LitNotCond( pLits[(int)pCanonPerm[i]], ((uCanonPhase>>i)&1) );
            pFanin = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(iLitNew) );
            pPermStart = pPerm + pFirsts[(int)pCanonPerm[i]];
            pChildren[nChildren++] = Abc_LitNotCond( iLitNew, If_DsdManPushInv(p, iLitNew, pPermStart) );
            for ( k = 0; k < (int)pFanin->nSupp; k++ )            
                pPermNew[j++] = pPermStart[k];
        }
        assert( j == nSSize );
        for ( j = 0; j < nSSize; j++ )
            pPerm[j] = pPermNew[j];
        Abc_TtStretch6( pTruth, nLits, p->nVars );
    }
    else assert( 0 );
    // create new graph
    Id = If_DsdObjFindOrAdd( p, Type, pChildren, nChildren, pTruth );
    return Abc_Var2Lit( Id, fCompl );
}